

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
          (string *__return_storage_ptr__,MeshGeometry *this,uint index)

{
  allocator local_9;
  
  if (index < 8) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->m_uvNames + index));
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MeshGeometry::GetTextureCoordChannelName( unsigned int index ) const {
    return index >= AI_MAX_NUMBER_OF_TEXTURECOORDS ? "" : m_uvNames[ index ];
}